

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_sub_array.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> test;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  int local_38 [12];
  
  local_38[4] = 2;
  local_38[5] = -1;
  local_38[6] = 2;
  local_38[7] = -4;
  local_38[0] = 2;
  local_38[1] = 4;
  local_38[2] = -7;
  local_38[3] = 5;
  local_38[8] = 3;
  __l._M_len = 9;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_51);
  iVar1 = find_max_subarray(&local_50);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::vector<int> test = {2, 4, -7, 5, 2, -1, 2, -4, 3};

	cout << find_max_subarray(test) << endl;
	return 0;
}